

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::RALocalAllocator::spillAfterAllocation(RALocalAllocator *this,InstNode *node)

{
  uint **ppuVar1;
  uint **ppuVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  BaseNode *node_00;
  WorkToPhysMap *pWVar6;
  BaseCompiler *pBVar7;
  PhysToWorkMap *pPVar8;
  PhysToWorkMap *pPVar9;
  uint *puVar10;
  uint *puVar11;
  uint *puVar12;
  RegGroup RVar13;
  Error EVar14;
  RABlock *pRVar15;
  RABlock *block;
  ulong uVar16;
  long lVar17;
  InstNode *node_01;
  RALocalAllocator *this_00;
  ulong unaff_R12;
  ulong unaff_R13;
  InstNode *pIVar18;
  bool bVar19;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  ulong uStack_88;
  ulong uStack_80;
  ulong uStack_78;
  RALocalAllocator *pRStack_70;
  InstNode *pIStack_68;
  long lStack_60;
  Error local_54;
  ulong local_50;
  RALocalAllocator *local_48;
  InstNode *local_40;
  InstNode *local_38;
  
  uVar16 = *(ulong *)(node + 0x20);
  node_01 = (InstNode *)(ulong)*(uint *)(uVar16 + 0x10);
  if (node_01 != (InstNode *)0x0) {
    local_48 = (RALocalAllocator *)&this->_curAssignment;
    lVar17 = uVar16 + 0x54;
    pIVar18 = (InstNode *)0x0;
    this_00 = this;
    local_40 = node_01;
    local_38 = node;
    do {
      if ((InstNode *)(ulong)*(uint *)(uVar16 + 0x10) <= pIVar18) {
        lStack_60 = 0x125140;
        spillAfterAllocation();
LAB_00125140:
        lStack_60 = 0x125145;
        spillAfterAllocation();
LAB_00125145:
        lStack_60 = 0x12514a;
        spillAfterAllocation();
LAB_0012514a:
        lStack_60 = 0x12514f;
        spillAfterAllocation();
LAB_0012514f:
        lStack_60 = 0x125154;
        spillAfterAllocation();
LAB_00125154:
        lStack_60 = 0x125159;
        spillAfterAllocation();
        (this_00->_cc->super_BaseBuilder)._cursor = *(BaseNode **)node_01;
        uStack_88 = uVar16;
        uStack_80 = unaff_R12;
        uStack_78 = unaff_R13;
        pRStack_70 = this;
        pIStack_68 = pIVar18;
        lStack_60 = lVar17;
        if (*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) {
          EVar14 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true);
          uVar16 = (ulong)EVar14;
          if (EVar14 != 0) {
            return EVar14;
          }
        }
        EVar14 = allocInst(this_00,node_01);
        if (EVar14 != 0) {
          return EVar14;
        }
        uVar4 = *(uint *)(block + 0xb8);
        if ((ulong)uVar4 == 0xffffffff) {
          pRVar15 = block + 0xbc;
LAB_001251fe:
          EVar14 = spillScratchGpRegsBeforeEntry(this_00,*(RegMask *)pRVar15);
          if (EVar14 != 0) {
            return EVar14;
          }
          if (*(long *)(block + 200) == 0) {
            EVar14 = BaseRAPass::setBlockEntryAssignment
                               (this_00->_pass,block,this_00->_block,&this_00->_curAssignment);
            if (EVar14 != 0) {
              return EVar14;
            }
            goto LAB_001253c0;
          }
          node_00 = *(BaseNode **)this_00->_pass->_extraBlock;
          pRVar15 = (RABlock *)BaseBuilder::setCursor(&this_00->_cc->super_BaseBuilder,node_00);
          pWVar6 = (this_00->_curAssignment)._workToPhysMap;
          memcpy((this_00->_tmpAssignment)._physToWorkMap,(this_00->_curAssignment)._physToWorkMap,
                 (ulong)(this_00->_tmpAssignment)._layout.physTotal * 4 + 0x20);
          memcpy((this_00->_tmpAssignment)._workToPhysMap,pWVar6,
                 (ulong)(this_00->_tmpAssignment)._layout.workCount);
          bVar19 = false;
          EVar14 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
          if (EVar14 != 0) goto LAB_001253bb;
          EVar14 = (Error)uVar16;
          if ((this_00->_cc->super_BaseBuilder)._cursor != node_00) {
            if ((uint)(byte)node_01[0x13] <= (byte)node_01[0x12] - 1) goto LAB_001253d8;
            lVar17 = (ulong)((byte)node_01[0x12] - 1) * 0x10;
            if ((*(uint *)(node_01 + lVar17 + 0x40) & 7) != 5) goto LAB_001253dd;
            (*(this_00->_cc->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_b0);
            uStack_a0 = *(undefined8 *)(node_01 + lVar17 + 0x40);
            uStack_98 = *(undefined8 *)(node_01 + lVar17 + 0x48);
            *(undefined4 *)(node_01 + lVar17 + 0x40) = uStack_b0;
            *(undefined4 *)(node_01 + lVar17 + 0x44) = uStack_ac;
            *(undefined4 *)(node_01 + lVar17 + 0x48) = uStack_a8;
            *(undefined4 *)(node_01 + lVar17 + 0x4c) = uStack_a4;
            node_01[0x34] = (InstNode)((byte)node_01[0x34] & 0xef);
            EVar14 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
            bVar19 = EVar14 == 0;
            if (bVar19) {
              pBVar7 = this_00->_cc;
              (pBVar7->super_BaseBuilder)._cursor = node_00;
              (*(pBVar7->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                        (pBVar7,&uStack_b0);
              EVar14 = (Error)uVar16;
            }
            goto LAB_00125340;
          }
        }
        else {
          if (uVar4 < *(uint *)(*(long *)block + 0xf0)) {
            pRVar15 = (RABlock *)((ulong)uVar4 * 0x20 + *(long *)(*(long *)block + 0xe8));
            goto LAB_001251fe;
          }
          allocBranch();
          pRVar15 = block;
LAB_001253d8:
          allocBranch();
LAB_001253dd:
          EVar14 = 3;
          bVar19 = false;
LAB_00125340:
          if (!bVar19) {
            bVar19 = false;
            goto LAB_001253bb;
          }
        }
        (this_00->_cc->super_BaseBuilder)._cursor = (BaseNode *)pRVar15;
        pWVar6 = (this_00->_curAssignment)._workToPhysMap;
        pPVar8 = (this_00->_curAssignment)._physToWorkMap;
        pPVar9 = (this_00->_tmpAssignment)._physToWorkMap;
        (this_00->_curAssignment)._workToPhysMap = (this_00->_tmpAssignment)._workToPhysMap;
        (this_00->_curAssignment)._physToWorkMap = pPVar9;
        (this_00->_tmpAssignment)._workToPhysMap = pWVar6;
        (this_00->_tmpAssignment)._physToWorkMap = pPVar8;
        lVar17 = 0;
        do {
          ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar17;
          puVar10 = *ppuVar1;
          puVar11 = ppuVar1[1];
          ppuVar2 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar17;
          puVar12 = ppuVar2[1];
          ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar17;
          *ppuVar1 = *ppuVar2;
          ppuVar1[1] = puVar12;
          ppuVar1 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar17;
          *ppuVar1 = puVar10;
          ppuVar1[1] = puVar11;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 4);
        bVar19 = true;
LAB_001253bb:
        if (bVar19) {
LAB_001253c0:
          EVar14 = 0;
        }
        return EVar14;
      }
      bVar19 = true;
      if ((*(byte *)(lVar17 + 2) & 2) != 0) {
        uVar4 = *(uint *)(lVar17 + -8);
        unaff_R12 = (ulong)uVar4;
        if (*(uint *)&this->_pass->field_0x148 <= uVar4) goto LAB_00125140;
        lVar5 = *(long *)(*(long *)&this->_pass->_workRegs + unaff_R12 * 8);
        if (*(char *)(lVar5 + 0x4a) != -1) goto LAB_00125110;
        if (uVar4 == 0xffffffff) goto LAB_00125145;
        if ((this->_curAssignment)._layout.workCount <= uVar4) goto LAB_0012514a;
        bVar3 = (this->_curAssignment)._workToPhysMap[unaff_R12].physIds[0];
        unaff_R13 = (ulong)bVar3;
        if (bVar3 == 0xff) goto LAB_00125110;
        RVar13 = *(RegGroup *)(lVar5 + 0x21);
        (this->_cc->super_BaseBuilder)._cursor = (BaseNode *)local_38;
        if (0x1f < bVar3) goto LAB_0012514f;
        RVar13 = RVar13 & kMaxValue;
        if (kExtraVirt3 < RVar13) goto LAB_00125154;
        if (((((this->_curAssignment)._physToWorkMap)->dirty)._masks._data[RVar13] >> (bVar3 & 0x1f)
            & 1) == 0) {
LAB_001250e9:
          lStack_60 = 0x1250f9;
          this_00 = local_48;
          RAAssignment::unassign((RAAssignment *)local_48,RVar13,uVar4,(uint)bVar3);
          EVar14 = 0;
        }
        else {
          lStack_60 = 0x1250e0;
          this_00 = this;
          local_50 = (ulong)RVar13;
          EVar14 = onSaveReg(this,RVar13,uVar4,(uint)bVar3);
          RVar13 = (RegGroup)local_50;
          if (EVar14 == 0) goto LAB_001250e9;
        }
        bVar19 = EVar14 == 0;
        node_01 = local_40;
        if (!bVar19) {
          local_54 = EVar14;
        }
      }
LAB_00125110:
      if (!bVar19) {
        return local_54;
      }
      pIVar18 = pIVar18 + 1;
      lVar17 = lVar17 + 0x20;
    } while (node_01 != pIVar18);
  }
  return 0;
}

Assistant:

Error RALocalAllocator::spillAfterAllocation(InstNode* node) noexcept {
  // This is experimental feature that would spill registers that don't have home-id and are last in this basic block.
  // This prevents saving these regs in other basic blocks and then restoring them (mostly relevant for loops).
  RAInst* raInst = node->passData<RAInst>();
  uint32_t count = raInst->tiedCount();

  for (uint32_t i = 0; i < count; i++) {
    RATiedReg* tiedReg = raInst->tiedAt(i);
    if (tiedReg->isLast()) {
      uint32_t workId = tiedReg->workId();
      RAWorkReg* workReg = workRegById(workId);
      if (!workReg->hasHomeRegId()) {
        RegGroup group = workReg->group();
        uint32_t assignedId = _curAssignment.workToPhysId(group, workId);
        if (assignedId != RAAssignment::kPhysNone) {
          _cc->_setCursor(node);
          ASMJIT_PROPAGATE(onSpillReg(group, workId, assignedId));
        }
      }
    }
  }

  return kErrorOk;
}